

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O3

bool export_scene_anim_as_obj
               (ogt_vox_scene *scene,string *out_name,bool out_file_per_frame,float voxel_scale,
               uint32_t frame_min,uint32_t frame_max,char *mesh_algorithm)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  uint uVar11;
  pointer pcVar12;
  ogt_vox_model *poVar13;
  uint32_t *puVar14;
  FILE *__stream;
  uint32_t i;
  uint uVar15;
  int iVar16;
  long lVar17;
  FILE *pFVar18;
  uint8_t *puVar19;
  undefined8 *puVar20;
  long *plVar21;
  ogt_mesh *poVar22;
  int iVar23;
  long *plVar24;
  ogt_mesh_vertex *poVar25;
  undefined7 in_register_00000011;
  ulong uVar26;
  byte bVar27;
  bool bVar28;
  ogt_vox_instance *instance;
  float fVar29;
  ulong uVar30;
  _Alloc_hider _Var31;
  undefined8 uVar32;
  ogt_vox_scene *scene_00;
  uint32_t value;
  uint32_t frame_max_local;
  FILE *local_858;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined4 local_830;
  uint32_t frame_min_local;
  ulong *local_828;
  long local_820;
  ulong local_818 [2];
  string *local_808;
  ogt_vox_scene *local_800;
  string out_material_name;
  string out_texture_name;
  string local_7a8;
  vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> meshes;
  ogt_voxel_meshify_context meshify_context;
  uint8_t tga_data [768];
  ogt_vox_palette palette;
  
  local_830 = (undefined4)CONCAT71(in_register_00000011,out_file_per_frame);
  frame_max_local = frame_max;
  frame_min_local = frame_min;
  get_frame_min_max(scene,&frame_min_local,&frame_max_local);
  memcpy(&palette,&scene->palette,0x400);
  lVar17 = 0;
  do {
    palette.color[lVar17].a = (uint8_t)lVar17;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x100);
  meshify_context.alloc_func = (ogt_voxel_meshify_alloc_func)0x0;
  meshify_context.free_func = (ogt_voxel_meshify_free_func)0x0;
  meshify_context.alloc_free_user_data = (void *)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  tga_data[0] = '\0';
  tga_data[1] = '\0';
  tga_data[2] = '\0';
  tga_data[3] = '\0';
  tga_data[4] = '\0';
  tga_data[5] = '\0';
  tga_data[6] = '\0';
  tga_data[7] = '\0';
  std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::resize
            (&meshes,(ulong)scene->num_models,(value_type *)tga_data);
  out_texture_name._M_dataplus._M_p = (pointer)&out_texture_name.field_2;
  pcVar12 = (out_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&out_texture_name,pcVar12,pcVar12 + out_name->_M_string_length);
  std::__cxx11::string::append((char *)&out_texture_name);
  out_material_name._M_dataplus._M_p = (pointer)&out_material_name.field_2;
  pcVar12 = (out_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&out_material_name,pcVar12,pcVar12 + out_name->_M_string_length);
  std::__cxx11::string::append((char *)&out_material_name);
  pFVar18 = fopen(out_texture_name._M_dataplus._M_p,"wb");
  _Var31 = out_texture_name._M_dataplus;
  if (pFVar18 != (FILE *)0x0) {
    lVar17 = 0;
    local_800 = scene;
    printf("writing file %s\n",out_texture_name._M_dataplus._M_p);
    puVar19 = tga_data + 2;
    do {
      puVar19[-2] = palette.color[lVar17].r;
      puVar19[-1] = palette.color[lVar17].g;
      *puVar19 = palette.color[lVar17].b;
      lVar17 = lVar17 + 1;
      puVar19 = puVar19 + 3;
    } while (lVar17 != 0x100);
    write_tga_24bit(tga_data,0x100,1,(FILE *)pFVar18);
    fclose(pFVar18);
    pFVar18 = fopen(out_material_name._M_dataplus._M_p,"wb");
    _Var31 = out_material_name._M_dataplus;
    if (pFVar18 != (FILE *)0x0) {
      printf("writing file %s\n",out_material_name._M_dataplus._M_p);
      fwrite("# opengametools vox2animobj - see source code at https://github.com/jpaver/opengametools/tree/master/apps/vox2animobj.cpp\r\n"
             ,0x7b,1,pFVar18);
      fwrite("\r\n",2,1,pFVar18);
      fwrite("newmtl palette\r\n",0x10,1,pFVar18);
      fwrite("illum 1\r\n",9,1,pFVar18);
      fwrite("Ka 0.000 0.000 0.000\r\n",0x16,1,pFVar18);
      fwrite("Kd 1.000 1.000 1.000\r\n",0x16,1,pFVar18);
      fwrite("Ks 0.000 0.000 0.000\r\n",0x16,1,pFVar18);
      fprintf(pFVar18,"map_Kd %s\r\n",out_texture_name._M_dataplus._M_p);
      fclose(pFVar18);
      bVar27 = 0;
      if (frame_min_local <= frame_max_local) {
        bVar27 = 0;
        pFVar18 = (FILE *)0x0;
        iVar23 = 0;
        scene_00 = local_800;
        value = frame_min_local;
        local_808 = out_name;
        do {
          if ((char)local_830 == '\0') {
            if (pFVar18 == (FILE *)0x0) {
              tga_data._0_8_ = tga_data + 0x10;
              pcVar12 = (local_808->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)tga_data,pcVar12,pcVar12 + local_808->_M_string_length);
              std::__cxx11::string::append((char *)tga_data);
              pFVar18 = (FILE *)open_obj_file((char *)tga_data._0_8_);
              if (pFVar18 == (FILE *)0x0) {
                printf("could not open file \'%s\' for write - aborting!",tga_data._0_8_);
                bVar27 = 1;
              }
              if ((uint8_t *)tga_data._0_8_ != tga_data + 0x10) {
                operator_delete((void *)tga_data._0_8_);
              }
              goto joined_r0x0010f9ad;
            }
          }
          else {
            if (pFVar18 != (FILE *)0x0) {
              fclose(pFVar18);
            }
            local_828 = local_818;
            pcVar12 = (local_808->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_828,pcVar12,pcVar12 + local_808->_M_string_length);
            std::__cxx11::string::append((char *)&local_828);
            zero_padded_string_abi_cxx11_(&local_7a8,value,3);
            uVar30 = 0xf;
            if (local_828 != local_818) {
              uVar30 = local_818[0];
            }
            if (uVar30 < local_7a8._M_string_length + local_820) {
              uVar32 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
                uVar32 = local_7a8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar32 < local_7a8._M_string_length + local_820) goto LAB_0010f907;
              puVar20 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_7a8,0,(char *)0x0,(ulong)local_828);
            }
            else {
LAB_0010f907:
              puVar20 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_828,(ulong)local_7a8._M_dataplus._M_p);
            }
            puVar1 = puVar20 + 2;
            if ((undefined8 *)*puVar20 == puVar1) {
              local_840 = *puVar1;
              uStack_838 = puVar20[3];
              local_850 = &local_840;
            }
            else {
              local_840 = *puVar1;
              local_850 = (undefined8 *)*puVar20;
            }
            local_848 = puVar20[1];
            *puVar20 = puVar1;
            puVar20[1] = 0;
            *(undefined1 *)puVar1 = 0;
            plVar21 = (long *)std::__cxx11::string::append((char *)&local_850);
            tga_data._0_8_ = tga_data + 0x10;
            plVar24 = plVar21 + 2;
            if ((long *)*plVar21 == plVar24) {
              tga_data._16_8_ = *plVar24;
              tga_data._24_8_ = plVar21[3];
            }
            else {
              tga_data._16_8_ = *plVar24;
              tga_data._0_8_ = (long *)*plVar21;
            }
            tga_data._8_8_ = plVar21[1];
            *plVar21 = (long)plVar24;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            if (local_850 != &local_840) {
              operator_delete(local_850);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
              operator_delete(local_7a8._M_dataplus._M_p);
            }
            if (local_828 != local_818) {
              operator_delete(local_828);
            }
            pFVar18 = (FILE *)open_obj_file((char *)tga_data._0_8_);
            iVar16 = 0;
            if (pFVar18 == (FILE *)0x0) {
              printf("could not open file \'%s\' for write - aborting!",tga_data._0_8_);
              bVar27 = 1;
              iVar16 = iVar23;
            }
            iVar23 = iVar16;
            if ((uint8_t *)tga_data._0_8_ != tga_data + 0x10) {
              operator_delete((void *)tga_data._0_8_);
            }
joined_r0x0010f9ad:
            if (pFVar18 == (FILE *)0x0) goto LAB_00110126;
          }
          fprintf(pFVar18,"o frame_%03u\n",(ulong)value);
          fprintf(pFVar18,"mtllib %s\n",out_material_name._M_dataplus._M_p);
          fwrite("usemtl palette\n",0xf,1,pFVar18);
          uVar15 = scene_00->num_instances;
          if (uVar15 != 0) {
            uVar30 = 0;
            local_858 = pFVar18;
            do {
              if (((scene_00->instances[uVar30].hidden == false) &&
                  (instance = scene_00->instances + uVar30,
                  scene_00->layers[instance->layer_index].hidden == false)) &&
                 (((ulong)instance->group_index == 0xffffffff ||
                  (scene_00->groups[instance->group_index].hidden == false)))) {
                ogt_vox_sample_instance_transform_global
                          ((ogt_vox_transform *)tga_data,instance,value,scene_00);
                if ((instance->model_anim).num_keyframes == 0) {
                  uVar15 = instance->model_index;
                }
                else {
                  uVar15 = ogt_vox_sample_anim_model(&instance->model_anim,value);
                }
                poVar13 = scene_00->models[uVar15];
                if ((poVar13 != (ogt_vox_model *)0x0) &&
                   (meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar15] == (ogt_mesh *)0x0)) {
                  printf("  - generating mesh for model of size %u x %u x %u using mesh_algorithm %s\n"
                         ,(ulong)poVar13->size_x,(ulong)poVar13->size_y,(ulong)poVar13->size_z,
                         mesh_algorithm);
                  iVar16 = strcmp(mesh_algorithm,"polygon");
                  if (iVar16 == 0) {
                    poVar22 = ogt_mesh_from_paletted_voxels_polygon
                                        (&meshify_context,poVar13->voxel_data,poVar13->size_x,
                                         poVar13->size_y,poVar13->size_z,(ogt_mesh_rgba *)&palette);
                  }
                  else {
                    iVar16 = strcmp(mesh_algorithm,"greedy");
                    if (iVar16 == 0) {
                      poVar22 = ogt_mesh_from_paletted_voxels_greedy
                                          (&meshify_context,poVar13->voxel_data,poVar13->size_x,
                                           poVar13->size_y,poVar13->size_z,(ogt_mesh_rgba *)&palette
                                          );
                    }
                    else {
                      poVar22 = ogt_mesh_from_paletted_voxels_simple
                                          (&meshify_context,poVar13->voxel_data,poVar13->size_x,
                                           poVar13->size_y,poVar13->size_z,(ogt_mesh_rgba *)&palette
                                          );
                    }
                  }
                  if (poVar22->vertex_count != 0) {
                    poVar25 = poVar22->vertices;
                    uVar26 = 0;
                    do {
                      uVar6 = poVar13->size_x;
                      uVar8 = poVar13->size_y;
                      uVar7 = (poVar25->pos).x;
                      uVar9 = (poVar25->pos).y;
                      (poVar25->pos).x = (float)uVar7 - (float)((uint)uVar6 >> 1);
                      (poVar25->pos).y = (float)uVar9 - (float)((uint)uVar8 >> 1);
                      (poVar25->pos).z = (poVar25->pos).z - (float)(poVar13->size_z >> 1);
                      fVar29 = (poVar25->normal).x;
                      if ((fVar29 != 0.0) || (NAN(fVar29))) {
                        fVar29 = (float)(uint)(fVar29 <= 0.0);
                      }
                      else {
                        fVar29 = (poVar25->normal).y;
                        if ((fVar29 != 0.0) || (NAN(fVar29))) {
                          fVar29 = (float)(0.0 < fVar29 ^ 3);
                        }
                        else {
                          fVar29 = (float)(0.0 < (poVar25->normal).z ^ 5);
                        }
                      }
                      (poVar25->normal).x = fVar29;
                      uVar26 = uVar26 + 1;
                      poVar25 = poVar25 + 1;
                    } while (uVar26 < poVar22->vertex_count);
                  }
                  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar15] = poVar22;
                }
                __stream = local_858;
                poVar22 = meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar15];
                if (poVar22 != (ogt_mesh *)0x0) {
                  if ((voxel_scale != 1.0) || (NAN(voxel_scale))) {
                    lVar17 = 0;
                    do {
                      lVar2 = lVar17 * 4;
                      fVar29 = *(float *)(tga_data + lVar2 + 4);
                      fVar4 = *(float *)(tga_data + lVar2 + 8);
                      fVar5 = *(float *)(tga_data + lVar2 + 0xc);
                      lVar3 = lVar17 * 4;
                      *(float *)(tga_data + lVar3) = *(float *)(tga_data + lVar2) * voxel_scale;
                      *(float *)(tga_data + lVar3 + 4) = fVar29 * voxel_scale;
                      *(float *)(tga_data + lVar3 + 8) = fVar4 * voxel_scale;
                      *(float *)(tga_data + lVar3 + 0xc) = fVar5 * voxel_scale;
                      lVar17 = lVar17 + 4;
                    } while (lVar17 != 0x10);
                    if (poVar22->vertex_count == 0) {
                      uVar15 = 0;
                    }
                    else {
                      lVar17 = 8;
                      uVar26 = 0;
                      do {
                        poVar25 = poVar22->vertices;
                        fVar29 = *(float *)((long)poVar25 + lVar17 + -8);
                        fVar4 = *(float *)((long)poVar25 + lVar17 + -4);
                        fVar5 = *(float *)((long)&(poVar25->pos).x + lVar17);
                        fprintf(__stream,"v %f %f %f\n",
                                (double)((float)tga_data._32_4_ * fVar5 +
                                         (float)tga_data._0_4_ * fVar29 +
                                         (float)tga_data._16_4_ * fVar4 + (float)tga_data._48_4_),
                                (double)((float)tga_data._36_4_ * fVar5 +
                                         (float)tga_data._4_4_ * fVar29 +
                                         (float)tga_data._20_4_ * fVar4 + (float)tga_data._52_4_),
                                (double)(fVar5 * (float)tga_data._40_4_ +
                                         fVar29 * (float)tga_data._8_4_ +
                                         fVar4 * (float)tga_data._24_4_ + (float)tga_data._56_4_));
                        uVar26 = uVar26 + 1;
                        uVar15 = poVar22->vertex_count;
                        lVar17 = lVar17 + 0x20;
                      } while (uVar26 < uVar15);
                    }
                  }
                  else if (poVar22->vertex_count == 0) {
                    uVar15 = 0;
                  }
                  else {
                    lVar17 = 8;
                    uVar26 = 0;
                    do {
                      poVar25 = poVar22->vertices;
                      fVar29 = *(float *)((long)poVar25 + lVar17 + -8);
                      fVar4 = *(float *)((long)poVar25 + lVar17 + -4);
                      fVar5 = *(float *)((long)&(poVar25->pos).x + lVar17);
                      fprintf(__stream,"v %i %i %i\n",
                              (ulong)(uint)(int)((float)tga_data._32_4_ * fVar5 +
                                                 (float)tga_data._0_4_ * fVar29 +
                                                 (float)tga_data._16_4_ * fVar4 +
                                                (float)tga_data._48_4_),
                              (ulong)(uint)(int)((float)tga_data._36_4_ * fVar5 +
                                                 (float)tga_data._4_4_ * fVar29 +
                                                 (float)tga_data._20_4_ * fVar4 +
                                                (float)tga_data._52_4_),
                              (ulong)(uint)(int)(fVar5 * (float)tga_data._40_4_ +
                                                 fVar29 * (float)tga_data._8_4_ +
                                                 fVar4 * (float)tga_data._24_4_ +
                                                (float)tga_data._56_4_));
                      uVar26 = uVar26 + 1;
                      uVar15 = poVar22->vertex_count;
                      lVar17 = lVar17 + 0x20;
                    } while (uVar26 < uVar15);
                  }
                  if (poVar22->index_count != 0) {
                    iVar16 = iVar23 + 1;
                    uVar26 = 0;
                    do {
                      poVar25 = poVar22->vertices;
                      puVar14 = poVar22->indices;
                      uVar15 = puVar14[uVar26];
                      uVar10 = puVar14[uVar26 + 1];
                      uVar11 = puVar14[uVar26 + 2];
                      fprintf(local_858,"f %u/%u/%u %u/%u/%u %u/%u/%u\n",(ulong)(uVar15 + iVar16),
                              (ulong)(poVar25[uVar15].color.a + 1),
                              (ulong)((int)poVar25[uVar15].normal.x + 1),(ulong)(uVar10 + iVar16),
                              (ulong)(poVar25[uVar10].color.a + 1),
                              (ulong)((int)poVar25[uVar10].normal.x + 1),(ulong)(uVar11 + iVar16),
                              (ulong)(poVar25[uVar11].color.a + 1),
                              (ulong)((int)poVar25[uVar11].normal.x + 1));
                      uVar26 = uVar26 + 3;
                    } while (uVar26 < poVar22->index_count);
                    uVar15 = poVar22->vertex_count;
                    scene_00 = local_800;
                  }
                  iVar23 = iVar23 + uVar15;
                  pFVar18 = local_858;
                }
                uVar15 = scene_00->num_instances;
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 < uVar15);
          }
          value = value + 1;
        } while (value <= frame_max_local);
        fclose(pFVar18);
      }
LAB_00110126:
      bVar28 = (bool)(bVar27 ^ 1);
      goto LAB_0011013d;
    }
  }
  bVar28 = false;
  printf("could not open file \'%s\' for write - aborting!",_Var31._M_p);
LAB_0011013d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_material_name._M_dataplus._M_p != &out_material_name.field_2) {
    operator_delete(out_material_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_texture_name._M_dataplus._M_p != &out_texture_name.field_2) {
    operator_delete(out_texture_name._M_dataplus._M_p);
  }
  if (meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar28;
}

Assistant:

bool export_scene_anim_as_obj(const ogt_vox_scene* scene, const std::string& out_name, bool out_file_per_frame, float voxel_scale, uint32_t frame_min, uint32_t frame_max, const char* mesh_algorithm) {
    get_frame_min_max(scene, frame_min, frame_max);

    // put the color index into the alpha component of every color in the palette
    ogt_vox_palette palette = scene->palette;
    for (uint32_t i = 0; i < 256; i++) {
        palette.color[i].a = (uint8_t)i;
    }

    // meshify all models.
    ogt_voxel_meshify_context meshify_context = {};
    std::vector<ogt_mesh*> meshes;
    meshes.resize(scene->num_models, nullptr);

    // go through all frames
    std::string out_texture_name = out_name + ".tga";
    std::string out_material_name = out_name + ".mtl";

    // write palette data as tga
    {
        FILE* fout = open_file(out_texture_name.c_str(), "wb");
        if (!fout) {
            printf("could not open file '%s' for write - aborting!", out_texture_name.c_str());
            return false;
        }

        printf("writing file %s\n", out_texture_name.c_str());
        uint8_t tga_data[256*3];
        for (uint32_t j = 0; j < 256; j++) {
            tga_data[j * 3 + 0] = palette.color[j].r;
            tga_data[j * 3 + 1] = palette.color[j].g;
            tga_data[j * 3 + 2] = palette.color[j].b;
        }
        write_tga_24bit(tga_data, 256, 1, fout);
        fclose(fout);
    }

    // write material data
    {
        FILE* fout = open_file(out_material_name.c_str(), "wb");
        if (!fout) {
            printf("could not open file '%s' for write - aborting!", out_material_name.c_str());
            return false;
        }
        printf("writing file %s\n", out_material_name.c_str());
        fprintf(fout, "# opengametools vox2animobj - see source code at https://github.com/jpaver/opengametools/tree/master/apps/vox2animobj.cpp\r\n"); // TODO(jpaver) proper header
        fprintf(fout, "\r\n");
        fprintf(fout, "newmtl palette\r\n");
        fprintf(fout, "illum 1\r\n");
        fprintf(fout, "Ka 0.000 0.000 0.000\r\n");
        fprintf(fout, "Kd 1.000 1.000 1.000\r\n");
        fprintf(fout, "Ks 0.000 0.000 0.000\r\n");
        fprintf(fout, "map_Kd %s\r\n", out_texture_name.c_str());
        fclose(fout);
    }

    // write geometry data
    bool error = false;
    {
        FILE* fout = nullptr;
        uint32_t base_vertex_index = 0;
        for (uint32_t frame_index = frame_min; frame_index <= frame_max; frame_index++) {
            if (out_file_per_frame) {
                if (fout)
                    fclose(fout);
                std::string out_obj_name = out_name + "-" + zero_padded_string(frame_index, 3) + ".obj";
                fout = open_obj_file(out_obj_name.c_str());
                if (!fout) {
                    printf("could not open file '%s' for write - aborting!", out_obj_name.c_str());
                    error = true;
                    break;
                }
                base_vertex_index = 0;
            }
            else if (!fout) {
                std::string out_obj_name = out_name + ".obj";
                fout = open_obj_file(out_obj_name.c_str());
                if (!fout) {
                    printf("could not open file '%s' for write - aborting!", out_obj_name.c_str());
                    error = true;
                    break;
                }
            }

            fprintf(fout, "o frame_%03u\n", frame_index);
            fprintf(fout, "mtllib %s\n", out_material_name.c_str());
            fprintf(fout, "usemtl palette\n");

            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* instance = &scene->instances[instance_index];
                // skip this instance if it's hidden in the .vox file
                if (instance->hidden)
                    continue;
                // skip this instance if it's part of a hidden layer in the .vox file
                if (scene->layers[instance->layer_index].hidden)
                    continue;
                // skip this instance if it's part of a hidden group
                if (instance->group_index != k_invalid_group_index && scene->groups[instance->group_index].hidden)
                    continue;

                ogt_vox_transform transform   = ogt_vox_sample_instance_transform_global(instance, frame_index, scene);
                uint32_t          model_index = ogt_vox_sample_instance_model(instance, frame_index);

                // just in time generate the mesh for this model if we haven't already done so.
                const ogt_vox_model* model = scene->models[model_index];
                if (model && !meshes[model_index]) {
                    // generate a mesh for this model using the mesh_algorithm specified
                    printf("  - generating mesh for model of size %u x %u x %u using mesh_algorithm %s\n", model->size_x, model->size_y, model->size_z, mesh_algorithm);
                    ogt_mesh* mesh =
                        (strcmp(mesh_algorithm, "polygon") == 0) ? ogt_mesh_from_paletted_voxels_polygon(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        (strcmp(mesh_algorithm, "greedy") == 0) ? ogt_mesh_from_paletted_voxels_greedy(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        (strcmp(mesh_algorithm, "simple") == 0) ? ogt_mesh_from_paletted_voxels_simple(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        NULL;

                    for (uint32_t i = 0; i < mesh->vertex_count; i++) {
                        // pre-bias the mesh vertices by the model dimensions - resets the center/pivot so it is at (0,0,0)
                        mesh->vertices[i].pos.x -= (float)(model->size_x / 2);
                        mesh->vertices[i].pos.y -= (float)(model->size_y / 2);
                        mesh->vertices[i].pos.z -= (float)(model->size_z / 2);
                        // the normal is always a unit vector aligned on one of the 6 cardinal directions, here we just
                        // precompute which index it was (same order as the 'vn' tags we wrote out when opening the file)
                        // and write it as a uint32_t into the x field. This allows us to avoid do this index conversion
                        // for every vert in a mesh, and not for every vert multiplied by the number of instances.
                        ogt_mesh_vec3& normal = mesh->vertices[i].normal;
                        uint32_t normal_index = normal.x != 0 ? (normal.x > 0.0f ? 0 : 1) :
                                                normal.y != 0 ? (normal.y > 0.0f ? 2 : 3) :
                                                (normal.z > 0.0f ? 4 : 5);
                        *(uint32_t*)&normal.x = normal_index;
                    }
                    // cache this mesh so we don't need to do it multiple times.
                    meshes[model_index] = mesh;
                }

                // some instances can have no geometry, so we just skip em
                const ogt_mesh* mesh = meshes[model_index];
                if (!mesh)
                    continue;

                if (voxel_scale != 1.0f) {
                    // bake voxel scale into the transform to avoid doing the scale per vertex.
                    float* transform_data = &transform.m00;
                    for (size_t i = 0; i < 16; i++) {
                        transform_data[i] *= voxel_scale;
                    }
                    // scaling vertex positions, so we do floating point writes
                    for (size_t i = 0; i < mesh->vertex_count; i++) {
                        ogt_mesh_vec3 pos = transform_point(transform, mesh->vertices[i].pos);
                        fprintf(fout, "v %f %f %f\n", pos.x, pos.y, pos.z);
                    }
                }
                else {
                    // we're not scaling positions, can write them much more compactly (smaller .obj file size) as int.
                    for (size_t i = 0; i < mesh->vertex_count; i++) {
                        ogt_mesh_vec3 pos = transform_point(transform, mesh->vertices[i].pos);
                        fprintf(fout, "v %i %i %i\n", (int32_t)pos.x, (int32_t)pos.y, (int32_t)pos.z);
                    }
                }
                // write faces
                for (size_t i = 0; i < mesh->index_count; i += 3) {
                    uint32_t v_i0 = base_vertex_index + mesh->indices[i + 0] + 1;
                    uint32_t v_i1 = base_vertex_index + mesh->indices[i + 1] + 1;
                    uint32_t v_i2 = base_vertex_index + mesh->indices[i + 2] + 1;
                    uint32_t t_i0 = mesh->vertices[mesh->indices[i+0]].color.a + 1;
                    uint32_t t_i1 = mesh->vertices[mesh->indices[i+1]].color.a + 1;
                    uint32_t t_i2 = mesh->vertices[mesh->indices[i+2]].color.a + 1;
                    uint32_t n_i0 = *((uint32_t*)&mesh->vertices[mesh->indices[i+0]].normal.x) + 1;
                    uint32_t n_i1 = *((uint32_t*)&mesh->vertices[mesh->indices[i+1]].normal.x) + 1;
                    uint32_t n_i2 = *((uint32_t*)&mesh->vertices[mesh->indices[i+2]].normal.x) + 1;
                    fprintf(fout, "f %u/%u/%u %u/%u/%u %u/%u/%u\n", v_i0, t_i0, n_i0, v_i1, t_i1, n_i1, v_i2, t_i2, n_i2);
                }
                base_vertex_index += mesh->vertex_count;
            }
        }

        if (fout) {
            fclose(fout);
        }
    }
    return !error;
}